

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_proxy.h
# Opt level: O2

sc_lv_base * __thiscall
sc_dt::sc_proxy<sc_dt::sc_lv_base>::assign_(sc_proxy<sc_dt::sc_lv_base> *this,sc_unsigned *a)

{
  assign_v_<sc_dt::sc_lv_base>(this,a);
  return (sc_lv_base *)this;
}

Assistant:

X& assign_( const sc_unsigned& a )
	{ assign_v_( *this, a ); return back_cast(); }